

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O0

void __thiscall btCollisionWorld::updateAabbs(btCollisionWorld *this)

{
  bool bVar1;
  int iVar2;
  btCollisionObject *this_00;
  long in_RDI;
  btCollisionObject *in_stack_00000008;
  btCollisionWorld *in_stack_00000010;
  btCollisionObject *colObj;
  int i;
  btTransform predictedTrans;
  CProfileSample __profile;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  btTransform *in_stack_ffffffffffffff80;
  int local_60;
  
  CProfileSample::CProfileSample
            ((CProfileSample *)in_stack_ffffffffffffff80,
             (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  btTransform::btTransform(in_stack_ffffffffffffff80);
  for (local_60 = 0;
      iVar2 = btAlignedObjectArray<btCollisionObject_*>::size
                        ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 8)),
      local_60 < iVar2; local_60 = local_60 + 1) {
    this_00 = (btCollisionObject *)
              btAlignedObjectArray<btCollisionObject_*>::operator[]
                        ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 8),local_60);
    if (((*(byte *)(in_RDI + 0x70) & 1) != 0) ||
       (bVar1 = btCollisionObject::isActive(this_00), bVar1)) {
      updateSingleAabb(in_stack_00000010,in_stack_00000008);
    }
  }
  CProfileSample::~CProfileSample((CProfileSample *)0x17a811);
  return;
}

Assistant:

void	btCollisionWorld::updateAabbs()
{
	BT_PROFILE("updateAabbs");

	btTransform predictedTrans;
	for ( int i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];

		//only update aabb of active objects
		if (m_forceUpdateAllAabbs || colObj->isActive())
		{
			updateSingleAabb(colObj);
		}
	}
}